

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

lys_module *
moveto_resolve_model
          (char *mod_name_ns,uint16_t mod_nam_ns_len,ly_ctx *ctx,lys_node *cur_snode,int is_name)

{
  byte bVar1;
  lys_module *module;
  char *pcVar2;
  int iVar3;
  lys_module *plVar4;
  lys_module **pplVar5;
  long lVar6;
  ushort uVar7;
  
  if (cur_snode != (lys_node *)0x0) {
    bVar1 = (ctx->models).parsing_sub_modules_count;
    if (bVar1 == 0) {
      pplVar5 = &cur_snode->module;
    }
    else {
      pplVar5 = (ctx->models).parsing_sub_modules + (bVar1 - 1);
    }
    module = *pplVar5;
    plVar4 = lys_main_module(module);
    pcVar2 = plVar4->name;
    iVar3 = strncmp(pcVar2,mod_name_ns,(ulong)mod_nam_ns_len);
    if ((iVar3 == 0) && (pcVar2[mod_nam_ns_len] == '\0')) {
      return plVar4;
    }
    bVar1 = module->imp_size;
    for (lVar6 = 0; (ulong)bVar1 * 0x38 - lVar6 != 0; lVar6 = lVar6 + 0x38) {
      plVar4 = *(lys_module **)(module->imp->rev + lVar6 + -0x10);
      pcVar2 = plVar4->name;
      iVar3 = strncmp(pcVar2,mod_name_ns,(ulong)mod_nam_ns_len);
      if ((iVar3 == 0) && (pcVar2[mod_nam_ns_len] == '\0')) {
        return plVar4;
      }
    }
  }
  for (uVar7 = 0; (int)(uint)uVar7 < (ctx->models).used; uVar7 = uVar7 + 1) {
  }
  return (lys_module *)0x0;
}

Assistant:

static struct lys_module *
moveto_resolve_model(const char *mod_name_ns, uint16_t mod_nam_ns_len, struct ly_ctx *ctx, struct lys_node *cur_snode,
                     int is_name)
{
    uint16_t i;
    const char *str;
    struct lys_module *mod, *mainmod;

    if (cur_snode) {
        /* detect if the XPath is used in augment - in such a case the module of the context node (cur_snode)
         * differs from the currently processed module. Then, we have to use the currently processed module
         * for searching for the module/namespace instead of the module of the context node */
        if (ctx->models.parsing_sub_modules_count &&
                cur_snode->module != ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1]) {
            mod = ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1];
        } else {
            mod = cur_snode->module;
        }
        mainmod = lys_main_module(mod);

        str = (is_name ? mainmod->name : mainmod->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return mainmod;
        }

        for (i = 0; i < mod->imp_size; ++i) {
            str = (is_name ? mod->imp[i].module->name : mod->imp[i].module->ns);
            if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
                return mod->imp[i].module;
            }
        }
    }

    for (i = 0; i < ctx->models.used; ++i) {
        if (!ctx->models.list[i]->implemented || ctx->models.list[i]->disabled) {
            /* skip not implemented or disabled modules */
            continue;
        }
        str = (is_name ? ctx->models.list[i]->name : ctx->models.list[i]->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return ctx->models.list[i];
        }
    }

    return NULL;
}